

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int h2o_file_send(h2o_req_t *req,int status,char *reason,char *path,h2o_iovec_t mime_type,int flags)

{
  h2o_iovec_t mime_type_00;
  size_t path_len;
  int local_4c;
  st_h2o_sendfile_generator_t *psStack_48;
  int is_dir;
  st_h2o_sendfile_generator_t *self;
  char *path_local;
  char *reason_local;
  h2o_req_t *phStack_28;
  int status_local;
  h2o_req_t *req_local;
  h2o_iovec_t mime_type_local;
  
  mime_type_local.base = (char *)mime_type.len;
  req_local = (h2o_req_t *)mime_type.base;
  self = (st_h2o_sendfile_generator_t *)path;
  path_local = reason;
  reason_local._4_4_ = status;
  phStack_28 = req;
  path_len = strlen(path);
  psStack_48 = create_generator(req,path,path_len,&local_4c,flags);
  if (psStack_48 == (st_h2o_sendfile_generator_t *)0x0) {
    mime_type_local.len._4_4_ = -1;
  }
  else {
    mime_type_00.len = (size_t)mime_type_local.base;
    mime_type_00.base = (char *)req_local;
    do_send_file(psStack_48,phStack_28,reason_local._4_4_,path_local,mime_type_00,
                 (h2o_mime_attributes_t *)0x0,1);
    mime_type_local.len._4_4_ = 0;
  }
  return mime_type_local.len._4_4_;
}

Assistant:

int h2o_file_send(h2o_req_t *req, int status, const char *reason, const char *path, h2o_iovec_t mime_type, int flags)
{
    struct st_h2o_sendfile_generator_t *self;
    int is_dir;

    if ((self = create_generator(req, path, strlen(path), &is_dir, flags)) == NULL)
        return -1;
    /* note: is_dir is not handled */
    do_send_file(self, req, status, reason, mime_type, NULL, 1);
    return 0;
}